

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

int mraa_intel_edison_mmap_read(mraa_gpio_context dev)

{
  uint32_t value;
  uint8_t offset;
  mraa_gpio_context dev_local;
  
  dev_local._4_4_ =
       (uint)((*(uint *)(mmap_reg + (long)(int)(uint)(byte)((long)(dev->pin / 0x20) << 2) + 4) &
              1 << ((byte)((long)dev->pin % 0x20) & 0x1f)) != 0);
  return dev_local._4_4_;
}

Assistant:

int
mraa_intel_edison_mmap_read(mraa_gpio_context dev)
{
    uint8_t offset = ((dev->pin / 32) * sizeof(uint32_t));
    uint32_t value;

    value = *(volatile uint32_t*) (mmap_reg + 0x04 + offset);
    if (value & (uint32_t)(1 << (dev->pin % 32))) {
        return 1;
    }
    return 0;
}